

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_67::BinaryReaderIR::OnExport
          (BinaryReaderIR *this,Index index,ExternalKind kind,Index item_index,string_view name)

{
  char *pcVar1;
  Offset OVar2;
  ExportModuleField *pEVar3;
  undefined1 local_c0 [8];
  Location loc_1;
  string_view name_local;
  Location loc;
  ExportModuleField *local_48;
  _Head_base<0UL,_wabt::ExportModuleField_*,_false> local_40;
  ExternalKind local_38;
  Index local_34;
  
  name_local.data_ = (char *)name.size_;
  loc_1.field_1._8_8_ = name.data_;
  pcVar1 = this->filename_;
  OVar2 = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  loc.field_1.field_0.line = 0;
  local_38 = kind;
  local_34 = item_index;
  loc.filename.data_ = (char *)strlen(pcVar1);
  name_local.size_ = (size_type)pcVar1;
  loc.filename.size_ = OVar2;
  MakeUnique<wabt::ExportModuleField,wabt::Location>
            ((wabt *)&local_48,(Location *)&name_local.size_);
  pEVar3 = local_48;
  string_view::to_string_abi_cxx11_
            ((string *)&name_local.size_,(string_view *)((long)&loc_1.field_1 + 8));
  std::__cxx11::string::operator=((string *)&pEVar3->export_,(string *)&name_local.size_);
  if ((size_type *)name_local.size_ != &loc.filename.size_) {
    operator_delete((void *)name_local.size_);
  }
  switch(local_38) {
  case First:
    if ((ulong)((long)(this->module_->funcs).
                      super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(this->module_->funcs).
                      super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3) <= (ulong)local_34) {
      __assert_fail("item_index < module_->funcs.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/binary-reader-ir.cc"
                    ,0x220,
                    "virtual Result wabt::(anonymous namespace)::BinaryReaderIR::OnExport(Index, ExternalKind, Index, string_view)"
                   );
    }
    break;
  case Table:
    if ((ulong)((long)(this->module_->tables).
                      super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(this->module_->tables).
                      super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3) <= (ulong)local_34) {
      __assert_fail("item_index < module_->tables.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/binary-reader-ir.cc"
                    ,0x223,
                    "virtual Result wabt::(anonymous namespace)::BinaryReaderIR::OnExport(Index, ExternalKind, Index, string_view)"
                   );
    }
    break;
  case Memory:
    if ((ulong)((long)(this->module_->memories).
                      super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(this->module_->memories).
                      super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3) <= (ulong)local_34) {
      __assert_fail("item_index < module_->memories.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/binary-reader-ir.cc"
                    ,0x226,
                    "virtual Result wabt::(anonymous namespace)::BinaryReaderIR::OnExport(Index, ExternalKind, Index, string_view)"
                   );
    }
    break;
  case Global:
    if ((ulong)((long)(this->module_->globals).
                      super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(this->module_->globals).
                      super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3) <= (ulong)local_34) {
      __assert_fail("item_index < module_->globals.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/binary-reader-ir.cc"
                    ,0x229,
                    "virtual Result wabt::(anonymous namespace)::BinaryReaderIR::OnExport(Index, ExternalKind, Index, string_view)"
                   );
    }
  }
  pcVar1 = this->filename_;
  OVar2 = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  loc_1.field_1.field_0.line = 0;
  loc_1.filename.data_ = (char *)strlen(pcVar1);
  local_c0 = (undefined1  [8])pcVar1;
  loc_1.filename.size_ = OVar2;
  Var::Var((Var *)&name_local.size_,local_34,(Location *)local_c0);
  Var::operator=(&(pEVar3->export_).var,(Var *)&name_local.size_);
  Var::~Var((Var *)&name_local.size_);
  (pEVar3->export_).kind = local_38;
  local_40._M_head_impl = local_48;
  local_48 = (ExportModuleField *)0x0;
  Module::AppendField(this->module_,
                      (unique_ptr<wabt::ExportModuleField,_std::default_delete<wabt::ExportModuleField>_>
                       *)&local_40);
  if (local_40._M_head_impl != (ExportModuleField *)0x0) {
    (*((local_40._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)3>).super_ModuleField.
      _vptr_ModuleField[1])();
  }
  local_40._M_head_impl = (ExportModuleField *)0x0;
  if (local_48 != (ExportModuleField *)0x0) {
    (**(code **)(*(long *)local_48 + 8))();
  }
  return (Result)Ok;
}

Assistant:

Result BinaryReaderIR::OnExport(Index index,
                                ExternalKind kind,
                                Index item_index,
                                string_view name) {
  auto field = MakeUnique<ExportModuleField>(GetLocation());
  Export& export_ = field->export_;
  export_.name = name.to_string();
  switch (kind) {
    case ExternalKind::Func:
      assert(item_index < module_->funcs.size());
      break;
    case ExternalKind::Table:
      assert(item_index < module_->tables.size());
      break;
    case ExternalKind::Memory:
      assert(item_index < module_->memories.size());
      break;
    case ExternalKind::Global:
      assert(item_index < module_->globals.size());
      break;
    case ExternalKind::Except:
      // Note: Can't check if index valid, exceptions section comes later.
      break;
  }
  export_.var = Var(item_index, GetLocation());
  export_.kind = kind;
  module_->AppendField(std::move(field));
  return Result::Ok;
}